

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O0

ssize_t bzip2_filter_read(archive_read_filter *self,void **p)

{
  int iVar1;
  char *pcVar2;
  int local_4c;
  char *pcStack_48;
  int err;
  char *detail;
  ssize_t ret;
  char *read_buf;
  size_t decompressed;
  private_data *state;
  void **p_local;
  archive_read_filter *self_local;
  
  decompressed = (size_t)self->data;
  if (*(char *)(decompressed + 0x61) == '\0') {
    *(undefined8 *)(decompressed + 0x18) = *(undefined8 *)(decompressed + 0x50);
    *(int *)(decompressed + 0x20) = (int)*(undefined8 *)(decompressed + 0x58);
    state = (private_data *)p;
    p_local = (void **)self;
    do {
      if (*(char *)(decompressed + 0x60) == '\0') {
        iVar1 = bzip2_reader_bid((archive_read_filter_bidder *)p_local[1],
                                 (archive_read_filter *)p_local[2]);
        if (iVar1 == 0) {
          *(undefined1 *)(decompressed + 0x61) = 1;
          (state->stream).next_in = *(char **)(decompressed + 0x50);
          return *(long *)(decompressed + 0x18) - *(long *)(decompressed + 0x50);
        }
        iVar1 = BZ2_bzDecompressInit((bz_stream *)decompressed,0,0);
        detail = (char *)(long)iVar1;
        if (detail == (char *)0xfffffffffffffffd) {
          iVar1 = BZ2_bzDecompressInit((bz_stream *)decompressed,0,1);
          detail = (char *)(long)iVar1;
        }
        if (detail != (char *)0x0) {
          pcStack_48 = (char *)0x0;
          local_4c = -1;
          if (detail == (char *)0xfffffffffffffff7) {
            pcStack_48 = "mis-compiled library";
          }
          else if (detail == (char *)0xfffffffffffffffd) {
            local_4c = 0xc;
            pcStack_48 = "out of memory";
          }
          else if (detail == (char *)0xfffffffffffffffe) {
            pcStack_48 = "invalid setup parameter";
          }
          pcVar2 = ": ";
          if (pcStack_48 == (char *)0x0) {
            pcVar2 = "";
          }
          archive_set_error((archive *)p_local[3],local_4c,
                            "Internal error initializing decompressor%s%s",pcVar2,pcStack_48);
          return -0x1e;
        }
        *(undefined1 *)(decompressed + 0x60) = 1;
      }
      ret = (ssize_t)__archive_read_filter_ahead
                               ((archive_read_filter *)p_local[2],1,(ssize_t *)&detail);
      if ((void *)ret == (void *)0x0) {
        archive_set_error((archive *)p_local[3],-1,"truncated bzip2 input");
        return -0x1e;
      }
      *(ssize_t *)decompressed = ret;
      *(int *)(decompressed + 8) = (int)detail;
      if (detail == (char *)0x0) {
        *(undefined1 *)(decompressed + 0x61) = 1;
        (state->stream).next_in = *(char **)(decompressed + 0x50);
        return *(long *)(decompressed + 0x18) - *(long *)(decompressed + 0x50);
      }
      iVar1 = BZ2_bzDecompress((bz_stream *)decompressed);
      detail = (char *)(long)iVar1;
      __archive_read_filter_consume((archive_read_filter *)p_local[2],*(long *)decompressed - ret);
      if (detail != (char *)0x0) {
        if (detail != (char *)0x4) {
          archive_set_error((archive *)p_local[3],-1,"bzip decompression failed");
          return -0x1e;
        }
        iVar1 = BZ2_bzDecompressEnd((bz_stream *)decompressed);
        if (iVar1 != 0) {
          archive_set_error((archive *)p_local[3],-1,"Failed to clean up decompressor");
          return -0x1e;
        }
        *(undefined1 *)(decompressed + 0x60) = 0;
      }
    } while (*(int *)(decompressed + 0x20) != 0);
    (state->stream).next_in = *(char **)(decompressed + 0x50);
    self_local = (archive_read_filter *)
                 (*(long *)(decompressed + 0x18) - *(long *)(decompressed + 0x50));
  }
  else {
    *p = (void *)0x0;
    self_local = (archive_read_filter *)0x0;
  }
  return (ssize_t)self_local;
}

Assistant:

static ssize_t
bzip2_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	const char *read_buf;
	ssize_t ret;

	state = (struct private_data *)self->data;

	if (state->eof) {
		*p = NULL;
		return (0);
	}

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	for (;;) {
		if (!state->valid) {
			if (bzip2_reader_bid(self->bidder, self->upstream) == 0) {
				state->eof = 1;
				*p = state->out_block;
				decompressed = state->stream.next_out
				    - state->out_block;
				return (decompressed);
			}
			/* Initialize compression library. */
			ret = BZ2_bzDecompressInit(&(state->stream),
					   0 /* library verbosity */,
					   0 /* don't use low-mem algorithm */);

			/* If init fails, try low-memory algorithm instead. */
			if (ret == BZ_MEM_ERROR)
				ret = BZ2_bzDecompressInit(&(state->stream),
					   0 /* library verbosity */,
					   1 /* do use low-mem algo */);

			if (ret != BZ_OK) {
				const char *detail = NULL;
				int err = ARCHIVE_ERRNO_MISC;
				switch (ret) {
				case BZ_PARAM_ERROR:
					detail = "invalid setup parameter";
					break;
				case BZ_MEM_ERROR:
					err = ENOMEM;
					detail = "out of memory";
					break;
				case BZ_CONFIG_ERROR:
					detail = "mis-compiled library";
					break;
				}
				archive_set_error(&self->archive->archive, err,
				    "Internal error initializing decompressor%s%s",
				    detail == NULL ? "" : ": ",
				    detail);
				return (ARCHIVE_FATAL);
			}
			state->valid = 1;
		}

		/* stream.next_in is really const, but bzlib
		 * doesn't declare it so. <sigh> */
		read_buf =
		    __archive_read_filter_ahead(self->upstream, 1, &ret);
		if (read_buf == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated bzip2 input");
			return (ARCHIVE_FATAL);
		}
		state->stream.next_in = (char *)(uintptr_t)read_buf;
		state->stream.avail_in = ret;
		/* There is no more data, return whatever we have. */
		if (ret == 0) {
			state->eof = 1;
			*p = state->out_block;
			decompressed = state->stream.next_out
			    - state->out_block;
			return (decompressed);
		}

		/* Decompress as much as we can in one pass. */
		ret = BZ2_bzDecompress(&(state->stream));
		__archive_read_filter_consume(self->upstream,
		    state->stream.next_in - read_buf);

		switch (ret) {
		case BZ_STREAM_END: /* Found end of stream. */
			switch (BZ2_bzDecompressEnd(&(state->stream))) {
			case BZ_OK:
				break;
			default:
				archive_set_error(&(self->archive->archive),
					  ARCHIVE_ERRNO_MISC,
					  "Failed to clean up decompressor");
				return (ARCHIVE_FATAL);
			}
			state->valid = 0;
			/* FALLTHROUGH */
		case BZ_OK: /* Decompressor made some progress. */
			/* If we filled our buffer, update stats and return. */
			if (state->stream.avail_out == 0) {
				*p = state->out_block;
				decompressed = state->stream.next_out
				    - state->out_block;
				return (decompressed);
			}
			break;
		default: /* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC, "bzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}
}